

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
* __thiscall
wasm::BranchUtils::BranchTargets::getBranches
          (unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
           *__return_storage_ptr__,BranchTargets *this,Name name)

{
  const_iterator cVar1;
  undefined1 local_28 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_28 = name.super_IString.str._M_len;
  cVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
          ::find(&(this->inner).branches._M_t,(key_type *)local_28);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->inner).branches._M_t._M_impl.super__Rb_tree_header
     ) {
    *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  else {
    std::
    _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&__return_storage_ptr__->_M_h,
                 (_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&cVar1._M_node[1]._M_left);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<Expression*> getBranches(Name name) const {
    auto iter = inner.branches.find(name);
    if (iter != inner.branches.end()) {
      return iter->second;
    }
    return {};
  }